

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint uVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  Expr *pEVar3;
  char *pcVar4;
  char *args_1;
  ASTNode *node;
  LiteralType type;
  undefined4 in_register_00000034;
  string local_38;
  VariableSym *local_18;
  VariableSym *variable_local;
  ASTPrinter *this_local;
  
  local_18 = (VariableSym *)CONCAT44(in_register_00000034,__fd);
  variable_local = (VariableSym *)this;
  pEVar3 = VariableSym::initializer(local_18);
  if (pEVar3 == (Expr *)0x0) {
    Symbol::name_abi_cxx11_(&local_18->super_Symbol);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    printf<char_const*>(this,"Variable: %s (NULL)\n",pcVar4);
    iVar2 = extraout_EAX_00;
  }
  else {
    Symbol::name_abi_cxx11_(&local_18->super_Symbol);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pEVar3 = VariableSym::initializer(local_18);
    uVar1 = (*(pEVar3->super_ASTNode)._vptr_ASTNode[3])();
    tos_abi_cxx11_(&local_38,(flow *)(ulong)uVar1,type);
    args_1 = (char *)std::__cxx11::string::c_str();
    printf<char_const*,char_const*>(this,"Variable: %s as %s\n",pcVar4,args_1);
    std::__cxx11::string::~string((string *)&local_38);
    node = &VariableSym::initializer(local_18)->super_ASTNode;
    print(this,"initializer",node);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void ASTPrinter::accept(VariableSym& variable) {
  if (variable.initializer()) {
    printf("Variable: %s as %s\n", variable.name().c_str(),
           tos(variable.initializer()->getType()).c_str());
    print("initializer", variable.initializer());
  } else {
    printf("Variable: %s (NULL)\n", variable.name().c_str());
  }
}